

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdGetPsbtBip32Data(void *handle,void *psbt_handle,int kind,uint32_t index,char *pubkey,
                       char **fingerprint,char **bip32_path)

{
  bool bVar1;
  undefined8 uVar2;
  CfdException *this;
  uint32_t in_ECX;
  int in_EDX;
  long in_RSI;
  long in_R8;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  CfdException *except;
  exception *std_except;
  KeyData *temp_key;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__range2;
  Pubkey target_pubkey;
  bool has_extpubkey;
  KeyData key;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  KeyData pk_obj;
  CfdCapiPsbtHandle *psbt_obj;
  char *work_path;
  char *work_fingerprint;
  int result;
  KeyData *in_stack_fffffffffffff910;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *in_stack_fffffffffffff918;
  string *in_stack_fffffffffffff920;
  undefined8 in_stack_fffffffffffff928;
  CfdError CVar3;
  CfdException *in_stack_fffffffffffff930;
  string *in_stack_fffffffffffff970;
  allocator *paVar4;
  string local_668;
  ByteData local_648;
  string local_630;
  undefined1 local_60a;
  allocator local_609;
  string local_608 [32];
  string *in_stack_fffffffffffffa18;
  void *in_stack_fffffffffffffa20;
  CfdSourceLocation local_5c8;
  ExtPubkey local_5b0;
  ByteData local_540;
  ExtPubkey local_528;
  ByteData local_4b8;
  Pubkey local_4a0;
  reference local_488;
  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
  local_480;
  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
  local_478;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *local_470;
  Pubkey local_468;
  byte local_449;
  KeyData local_448;
  undefined1 local_2f2;
  allocator local_2f1;
  string local_2f0 [32];
  CfdSourceLocation local_2d0;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_2b8;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_2a0;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_288;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_270 [12];
  NetType in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffecc;
  allocator local_101;
  string local_100 [32];
  CfdSourceLocation local_e0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  long local_88;
  allocator local_79;
  string local_78 [48];
  string *local_48;
  char *local_40;
  undefined4 local_34;
  undefined8 *local_30;
  long local_28;
  uint32_t local_20;
  int local_1c;
  long local_18;
  int local_4;
  
  local_34 = 0xffffffff;
  local_40 = (char *)0x0;
  local_48 = (string *)0x0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"PsbtHandle",&local_79);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  CVar3 = (CfdError)((ulong)in_stack_fffffffffffff928 >> 0x20);
  local_88 = local_18;
  if (local_28 == 0) {
    local_a0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_a0.filename = local_a0.filename + 1;
    local_a0.line = 0x684;
    local_a0.funcname = "CfdGetPsbtBip32Data";
    cfd::core::logger::warn<>(&local_a0,"pubkey is null.");
    local_c2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"Failed to parameter. pubkey is null.",paVar4);
    cfd::core::CfdException::CfdException(in_stack_fffffffffffff930,CVar3,in_stack_fffffffffffff920)
    ;
    local_c2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(local_18 + 0x18) == 0) {
    local_e0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_e0.filename = local_e0.filename + 1;
    local_e0.line = 0x68a;
    local_e0.funcname = "CfdGetPsbtBip32Data";
    cfd::core::logger::warn<>(&local_e0,"psbt is null.");
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"Failed to handle statement. psbt is null.",&local_101);
    cfd::core::CfdException::CfdException(in_stack_fffffffffffff930,CVar3,in_stack_fffffffffffff920)
    ;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::capi::ParsePubkey
            (in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector(local_270);
  CVar3 = (CfdError)((ulong)in_stack_fffffffffffff928 >> 0x20);
  if (local_1c == 2) {
    cfd::core::Psbt::GetTxInKeyDataList(&local_288,*(Psbt **)(local_88 + 0x18),local_20);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator=
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
               in_stack_fffffffffffff920,in_stack_fffffffffffff918);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
               in_stack_fffffffffffff920);
  }
  else if (local_1c == 3) {
    cfd::core::Psbt::GetTxOutKeyDataList(&local_2a0,*(Psbt **)(local_88 + 0x18),local_20);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator=
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
               in_stack_fffffffffffff920,in_stack_fffffffffffff918);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
               in_stack_fffffffffffff920);
  }
  else {
    if (local_1c != 4) {
      local_2d0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                   ,0x2f);
      local_2d0.filename = local_2d0.filename + 1;
      local_2d0.line = 0x699;
      local_2d0.funcname = "CfdGetPsbtBip32Data";
      cfd::core::logger::warn<int&>(&local_2d0,"kind is invalid: {}",&local_1c);
      local_2f2 = 1;
      uVar2 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f0,"Failed to parameter. kind is invalid.",&local_2f1);
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffff930,CVar3,in_stack_fffffffffffff920);
      local_2f2 = 0;
      __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::core::Psbt::GetGlobalXpubkeyDataList(&local_2b8,*(Psbt **)(local_88 + 0x18));
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator=
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
               in_stack_fffffffffffff920,in_stack_fffffffffffff918);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
               in_stack_fffffffffffff920);
  }
  cfd::core::KeyData::KeyData(&local_448);
  local_449 = cfd::core::KeyData::HasExtPubkey((KeyData *)(local_270 + 1));
  cfd::core::KeyData::GetPubkey(&local_468,(KeyData *)(local_270 + 1));
  local_470 = local_270;
  local_478._M_current =
       (KeyData *)
       std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::begin(local_470);
  local_480._M_current =
       (KeyData *)
       std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::end(local_470);
  do {
    bVar1 = __gnu_cxx::operator!=(&local_478,&local_480);
    CVar3 = (CfdError)((ulong)in_stack_fffffffffffff928 >> 0x20);
    if (!bVar1) {
LAB_005f90f0:
      bVar1 = cfd::core::KeyData::IsValid(&local_448);
      if (bVar1) {
        if (local_30 != (undefined8 *)0x0) {
          cfd::core::KeyData::GetFingerprint(&local_648,&local_448);
          cfd::core::ByteData::GetHex_abi_cxx11_(&local_630,&local_648);
          local_40 = cfd::capi::CreateString(in_stack_fffffffffffff970);
          std::__cxx11::string::~string((string *)&local_630);
          cfd::core::ByteData::~ByteData((ByteData *)0x5f9313);
        }
        if (in_stack_00000008 != (undefined8 *)0x0) {
          cfd::core::KeyData::GetBip32Path_abi_cxx11_(&local_668,&local_448,kApostrophe,false);
          in_stack_fffffffffffff920 = (string *)cfd::capi::CreateString(in_stack_fffffffffffff970);
          local_48 = in_stack_fffffffffffff920;
          std::__cxx11::string::~string((string *)&local_668);
        }
        if (local_30 != (undefined8 *)0x0) {
          *local_30 = local_40;
        }
        if (in_stack_00000008 != (undefined8 *)0x0) {
          *in_stack_00000008 = local_48;
        }
        local_4 = 0;
        cfd::core::Pubkey::~Pubkey((Pubkey *)0x5f942e);
        cfd::core::KeyData::~KeyData(in_stack_fffffffffffff910);
        std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
                  ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                   in_stack_fffffffffffff920);
        cfd::core::KeyData::~KeyData(in_stack_fffffffffffff910);
        return local_4;
      }
      local_5c8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                   ,0x2f);
      local_5c8.filename = local_5c8.filename + 1;
      local_5c8.line = 0x6b1;
      local_5c8.funcname = "CfdGetPsbtBip32Data";
      cfd::core::KeyData::ToString_abi_cxx11_
                ((string *)&stack0xfffffffffffffa18,(KeyData *)(local_270 + 1),true,kApostrophe,
                 false);
      cfd::core::logger::warn<std::__cxx11::string>
                (&local_5c8,"pubkey not found: {}",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffa18);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffa18);
      local_60a = 1;
      this = (CfdException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_608,"Failed to parameter. pubkey not found",&local_609);
      cfd::core::CfdException::CfdException(this,CVar3,in_stack_fffffffffffff920);
      local_60a = 0;
      __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    local_488 = __gnu_cxx::
                __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
                ::operator*(&local_478);
    cfd::core::KeyData::GetPubkey(&local_4a0,local_488);
    bVar1 = cfd::core::Pubkey::Equals(&local_4a0,&local_468);
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x5f8ee9);
    CVar3 = (CfdError)((ulong)in_stack_fffffffffffff928 >> 0x20);
    if (bVar1) {
      if ((local_449 & 1) == 0) {
        cfd::core::KeyData::operator=(&local_448,local_488);
        goto LAB_005f90f0;
      }
      cfd::core::KeyData::GetExtPubkey(&local_528,local_488);
      cfd::core::ExtPubkey::GetData(&local_4b8,&local_528);
      cfd::core::KeyData::GetExtPubkey(&local_5b0,(KeyData *)(local_270 + 1));
      cfd::core::ExtPubkey::GetData(&local_540,&local_5b0);
      bVar1 = cfd::core::ByteData::Equals(&local_4b8,&local_540);
      cfd::core::ByteData::~ByteData((ByteData *)0x5f8f88);
      cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffff910);
      cfd::core::ByteData::~ByteData((ByteData *)0x5f8fa2);
      cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffff910);
      CVar3 = (CfdError)((ulong)in_stack_fffffffffffff928 >> 0x20);
      if (bVar1) {
        cfd::core::KeyData::operator=(&local_448,local_488);
        goto LAB_005f90f0;
      }
    }
    __gnu_cxx::
    __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
    ::operator++(&local_478);
  } while( true );
}

Assistant:

int CfdGetPsbtBip32Data(
    void* handle, void* psbt_handle, int kind, uint32_t index,
    const char* pubkey, char** fingerprint, char** bip32_path) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_fingerprint = nullptr;
  char* work_path = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }
    KeyData pk_obj = ParsePubkey(kind, pubkey, psbt_obj->net_type);

    std::vector<KeyData> key_list;
    if (kind == kCfdPsbtRecordInputBip32) {
      key_list = psbt_obj->psbt->GetTxInKeyDataList(index);
    } else if (kind == kCfdPsbtRecordOutputBip32) {
      key_list = psbt_obj->psbt->GetTxOutKeyDataList(index);
    } else if (kind == kCfdPsbtRecordGloalXpub) {
      key_list = psbt_obj->psbt->GetGlobalXpubkeyDataList();
    } else {
      warn(CFD_LOG_SOURCE, "kind is invalid: {}", kind);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. kind is invalid.");
    }

    KeyData key;
    bool has_extpubkey = pk_obj.HasExtPubkey();
    Pubkey target_pubkey = pk_obj.GetPubkey();
    for (const auto& temp_key : key_list) {
      if (temp_key.GetPubkey().Equals(target_pubkey)) {
        if (has_extpubkey) {
          if (temp_key.GetExtPubkey().GetData().Equals(
                  pk_obj.GetExtPubkey().GetData())) {
            key = temp_key;
            break;
          }
        } else {
          key = temp_key;
          break;
        }
      }
    }
    if (!key.IsValid()) {
      warn(CFD_LOG_SOURCE, "pubkey not found: {}", pk_obj.ToString());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey not found");
    }

    if (fingerprint != nullptr) {
      work_fingerprint = CreateString(key.GetFingerprint().GetHex());
    }
    if (bip32_path != nullptr) work_path = CreateString(key.GetBip32Path());

    if (fingerprint != nullptr) *fingerprint = work_fingerprint;
    if (bip32_path != nullptr) *bip32_path = work_path;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_fingerprint, &work_path);
  return result;
}